

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O3

HTMLElement * __thiscall choc::html::HTMLElement::addDiv(HTMLElement *this)

{
  pointer pHVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"div","");
  std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
  emplace_back<std::__cxx11::string>
            ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
             &this->children,&local_38);
  pHVar1 = (this->children).
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pHVar1 + -1;
}

Assistant:

HTMLElement& addDiv()                               { return addChild ("div"); }